

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

Token __thiscall czh::lexer::NumberMatch::get_token(NumberMatch *this,int ch)

{
  Token TVar1;
  
  if (ch - 0x30U < 10) {
    return INT;
  }
  if (ch == 0x2e) {
    this->_is_double = true;
    TVar1 = DOT;
  }
  else if ((ch & 0xffffffdfU) == 0x45) {
    TVar1 = EXP;
  }
  else {
    if (ch == 0x2d) {
      return SIGN;
    }
    if (ch == 0x2b) {
      return SIGN;
    }
    if (ch == -1) {
      TVar1 = END;
    }
    else {
      TVar1 = UNEXPECTED;
    }
  }
  return TVar1;
}

Assistant:

Token get_token(int ch = -1)
    {
      if (std::isdigit(ch))
        return Token::INT;
      else if (ch == '.')
      {
        _is_double = true;
        return Token::DOT;
      }
      else if (ch == 'e' || ch == 'E')
        return Token::EXP;
      else if (ch == '+' || ch == '-')
        return Token::SIGN;
      else if (ch == -1)
        return Token::END;
      return Token::UNEXPECTED;
    }